

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_world_level(parser *p)

{
  errr eVar1;
  char *pcVar2;
  int local_44;
  int *piStack_40;
  wchar_t i;
  level *lev;
  level_map_conflict *map;
  char *t_name;
  char *pcStack_20;
  wchar_t depth;
  char *l_name;
  parser *p_local;
  
  l_name = (char *)p;
  pcStack_20 = parser_getsym(p,"locality");
  t_name._4_4_ = parser_getint((parser *)l_name,"depth");
  map = (level_map_conflict *)parser_getsym((parser *)l_name,"topography");
  lev = (level *)parser_priv((parser *)l_name);
  lev->topography = lev->topography + TOP_PLAIN;
  if (lev->topography == TOP_PLAIN) {
    pcVar2 = (char *)mem_zalloc(0x50);
    lev->north = pcVar2;
  }
  else {
    pcVar2 = (char *)mem_realloc(lev->north,(long)(int)lev->topography * 0x50);
    lev->north = pcVar2;
    memset(lev->north + (long)(int)(lev->topography - TOP_PLAIN) * 0x50,0,0x50);
  }
  piStack_40 = (int *)(lev->north + (long)(int)(lev->topography - TOP_PLAIN) * 0x50);
  *piStack_40 = lev->topography - TOP_PLAIN;
  eVar1 = grab_name("locality",pcStack_20,localities,0x27,&local_44);
  if (eVar1 == 0) {
    piStack_40[3] = local_44;
    piStack_40[1] = t_name._4_4_;
    eVar1 = grab_name("topography",(char *)map,topography,0xb,&local_44);
    if (eVar1 == 0) {
      piStack_40[4] = local_44;
      if (piStack_40[4] == 0) {
        *(int *)&lev->field_0x14 = *(int *)&lev->field_0x14 + 1;
        if (*(int *)&lev->field_0x14 == 1) {
          pcVar2 = (char *)mem_zalloc(0x28);
          lev->east = pcVar2;
        }
        else {
          pcVar2 = (char *)mem_realloc(lev->east,(long)*(int *)&lev->field_0x14 * 0x28);
          lev->east = pcVar2;
        }
        *(topography *)(lev->east + (long)(*(int *)&lev->field_0x14 + -1) * 0x28) =
             lev->topography - TOP_PLAIN;
        pcVar2 = string_make(pcStack_20);
        *(char **)(lev->east + (long)(*(int *)&lev->field_0x14 + -1) * 0x28 + 8) = pcVar2;
        pcVar2 = lev->east + (long)(*(int *)&lev->field_0x14 + -1) * 0x28 + 0x10;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        pcVar2 = lev->east + (long)(*(int *)&lev->field_0x14 + -1) * 0x28 + 0x18;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        pcVar2 = lev->east + (long)(*(int *)&lev->field_0x14 + -1) * 0x28 + 0x20;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
      }
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_INVALID_LOCALITY;
    }
  }
  else {
    p_local._4_4_ = PARSE_ERROR_INVALID_LOCALITY;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_world_level(struct parser *p) {
	const char *l_name = parser_getsym(p, "locality");
	const int depth = parser_getint(p, "depth");
	const char *t_name = parser_getsym(p, "topography");
	struct level_map *map = parser_priv(p);
	struct level *lev;
	int i;

	/* Make a new level */
	map->num_levels++;
	if (map->num_levels == 1) {
		map->levels = mem_zalloc(sizeof(struct level));
	} else {
		map->levels = mem_realloc(map->levels,
								  map->num_levels * sizeof(struct level));
		memset(&map->levels[map->num_levels - 1], 0, sizeof(struct level));
	}
	lev = &map->levels[map->num_levels - 1];
	lev->index = map->num_levels - 1;

	if (grab_name("locality", l_name, localities, N_ELEMENTS(localities), &i))
		return PARSE_ERROR_INVALID_LOCALITY;
	lev->locality = i;
	lev->depth = depth;
	if (grab_name("topography", t_name, topography, N_ELEMENTS(topography), &i))
		return PARSE_ERROR_INVALID_LOCALITY;
	lev->topography = i;

	/* Record towns */
	if (lev->topography == TOP_TOWN) {
		map->num_towns++;
		if (map->num_towns == 1) {
			map->towns = mem_zalloc(sizeof(struct town));
		} else {
			map->towns = mem_realloc(map->towns,
									 map->num_towns * sizeof(struct town));
		}
		map->towns[map->num_towns - 1].index = map->num_levels - 1;
		map->towns[map->num_towns - 1].code = string_make(l_name);
		map->towns[map->num_towns - 1].ego = NULL;
		map->towns[map->num_towns - 1].stores = NULL;
		map->towns[map->num_towns - 1].num_stores = 0;
	}

	return PARSE_ERROR_NONE;
}